

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

void array_run_container_intersection
               (array_container_t *src_1,run_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  _Bool _Var2;
  int *in_RDX;
  run_container_t *in_RSI;
  int *in_RDI;
  uint16_t arrayval;
  int32_t newcard;
  rle16_t rle;
  int32_t arraypos;
  int32_t rlepos;
  array_container_t *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 preserve;
  int iVar3;
  int32_t in_stack_ffffffffffffffdc;
  rle16_t rVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t pos;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  
  preserve = (undefined1)((uint)in_stack_ffffffffffffffd8 >> 0x18);
  _Var2 = run_container_is_full(in_RSI);
  if (_Var2) {
    if (in_RDX != in_RDI) {
      array_container_copy
                ((array_container_t *)CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8);
    }
  }
  else {
    if (in_RDX[1] < *in_RDI) {
      array_container_grow
                ((array_container_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,(_Bool)preserve);
    }
    if (in_RSI->n_runs != 0) {
      iVar5 = 0;
      pos = 0;
      rVar4 = *in_RSI->runs;
      iVar3 = 0;
      while (pos < *in_RDI) {
        uVar1 = *(ushort *)(*(long *)(in_RDI + 2) + (long)pos * 2);
        while (((uint)rVar4 & 0xffff) + ((uint)rVar4 >> 0x10) < (uint)uVar1) {
          iVar5 = iVar5 + 1;
          if (iVar5 == in_RSI->n_runs) {
            *in_RDX = iVar3;
            return;
          }
          rVar4 = in_RSI->runs[iVar5];
        }
        if ((uint)uVar1 < ((uint)rVar4 & 0xffff)) {
          pos = advanceUntil(*(uint16_t **)(in_RDI + 2),pos,*in_RDI,rVar4.value);
        }
        else {
          *(ushort *)(*(long *)(in_RDX + 2) + (long)iVar3 * 2) = uVar1;
          iVar3 = iVar3 + 1;
          pos = pos + 1;
        }
      }
      *in_RDX = iVar3;
    }
  }
  return;
}

Assistant:

void array_run_container_intersection(const array_container_t *src_1,
                                      const run_container_t *src_2,
                                      array_container_t *dst) {
    if (run_container_is_full(src_2)) {
        if (dst != src_1) array_container_copy(src_1, dst);
        return;
    }
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    if (src_2->n_runs == 0) {
        return;
    }
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t rle = src_2->runs[rlepos];
    int32_t newcard = 0;
    while (arraypos < src_1->cardinality) {
        const uint16_t arrayval = src_1->array[arraypos];
        while (rle.value + rle.length <
               arrayval) {  // this will frequently be false
            ++rlepos;
            if (rlepos == src_2->n_runs) {
                dst->cardinality = newcard;
                return;  // we are done
            }
            rle = src_2->runs[rlepos];
        }
        if (rle.value > arrayval) {
            arraypos = advanceUntil(src_1->array, arraypos, src_1->cardinality,
                                    rle.value);
        } else {
            dst->array[newcard] = arrayval;
            newcard++;
            arraypos++;
        }
    }
    dst->cardinality = newcard;
}